

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O2

Vector3d *
opengv::generateRandomDirectionTranslation(Vector3d *__return_storage_ptr__,double parallax)

{
  Matrix3d rotation;
  undefined1 local_88 [16];
  scalar_constant_op<double> local_78;
  Vector3d *local_70;
  Matrix<double,_3,_3,_0,_3,_3> local_60;
  
  generateRandomRotation();
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = 1.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = 0.0;
  local_88._0_8_ = &local_60;
  local_88._8_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            (__return_storage_ptr__,
             (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
              *)local_88);
  local_78.m_other = parallax;
  local_70 = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (__return_storage_ptr__,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomDirectionTranslation( double parallax )
{
  Matrix3d rotation = generateRandomRotation();
  Vector3d translation;
  translation << 1.0, 0.0, 0.0;
  translation = rotation * translation;
  translation = parallax * translation;
  return translation;
}